

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
webfront::http::Headers::getHeaderValue_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Headers *this,string_view headerName)

{
  pointer pHVar1;
  bool bVar2;
  pointer pHVar3;
  string_view s1;
  
  pHVar3 = (this->headers).
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (this->headers).
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pHVar3 == pHVar1) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      return __return_storage_ptr__;
    }
    s1._M_str = (pHVar3->name)._M_dataplus._M_p;
    s1._M_len = (pHVar3->name)._M_string_length;
    bVar2 = caseInsensitiveEqual(s1,headerName);
    if (bVar2) break;
    pHVar3 = pHVar3 + 1;
  }
  ::std::_Optional_payload_base<std::__cxx11::string>::
  _Optional_payload_base<std::__cxx11::string_const&>
            ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,&pHVar3->value);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::optional<std::string> getHeaderValue(std::string_view headerName) const {
        for (auto& header : headers)
            if (caseInsensitiveEqual(header.name, headerName)) return header.value;
        return {};
    }